

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::WriteBuffer
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem dstBuffer,cl_bool blockingWrite,
          size_t dstOffset,size_t bytesToWrite,void *srcPtr,cl_uint numEventsInWaitList,
          cl_event *eventWaitList,cl_event *event)

{
  uint64_t *puVar1;
  cl_int cVar2;
  cl_icd_dispatch *pcVar3;
  int in_ECX;
  size_t in_RDX;
  cl_event *unaff_RBX;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  CLIntercept *in_R9;
  cl_event *unaff_R14;
  void *in_stack_00000008;
  size_t srcBufferSize;
  cl_mem srcBuffer;
  uintptr_t uiptr;
  uchar *bptr;
  size_t alignSize;
  size_t srcOffset;
  cl_context context;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffee8;
  lock_guard<std::mutex> *in_stack_fffffffffffffef0;
  cl_mem local_98;
  ulong local_78;
  size_t in_stack_ffffffffffffff90;
  cl_mem in_stack_ffffffffffffff98;
  cl_mem srcBuffer_00;
  uint in_stack_ffffffffffffffa8;
  cl_context in_stack_ffffffffffffffb0;
  cl_uint numEventsInWaitList_00;
  CLIntercept *pCVar4;
  
  pCVar4 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  numEventsInWaitList_00 = (cl_uint)pCVar4;
  srcBuffer_00 = (cl_mem)0x0;
  pcVar3 = dispatch(in_RDI);
  cVar2 = (*pcVar3->clGetCommandQueueInfo)(in_RSI,0x1090,8,&stack0xffffffffffffffa0,(size_t *)0x0);
  local_78 = 0;
  if (cVar2 == 0) {
    local_78 = (ulong)in_stack_00000008 & 0xfff;
    in_stack_00000008 = (void *)((long)in_stack_00000008 - local_78);
  }
  local_98 = (cl_mem)0x0;
  if (cVar2 == 0) {
    puVar1 = &in_R9->m_ProcessId;
    pcVar3 = dispatch(in_RDI);
    local_98 = (*pcVar3->clCreateBuffer)
                         ((cl_context)srcBuffer_00,0xc,(long)puVar1 + local_78,in_stack_00000008,
                          (cl_int *)&stack0xffffffffffffffac);
  }
  if (cVar2 == 0) {
    cVar2 = CopyBufferHelper(in_R9,in_stack_ffffffffffffffb0,
                             (cl_command_queue)(ulong)in_stack_ffffffffffffffa8,srcBuffer_00,
                             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDX,
                             (size_t)in_RSI,numEventsInWaitList_00,unaff_RBX,unaff_R14);
  }
  if ((cVar2 == 0) && (in_ECX != 0)) {
    pcVar3 = dispatch(in_RDI);
    cVar2 = (*pcVar3->clFinish)(in_RSI);
  }
  pcVar3 = dispatch(in_RDI);
  (*pcVar3->clReleaseMemObject)(local_98);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21d4fd);
  return cVar2;
}

Assistant:

cl_int CLIntercept::WriteBuffer(
    cl_command_queue commandQueue,
    cl_mem dstBuffer,
    cl_bool blockingWrite,
    size_t dstOffset,
    size_t bytesToWrite,
    const void* srcPtr,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    size_t  srcOffset = 0;

    // Align the passed-in pointer to a page boundary.
    if( errorCode == CL_SUCCESS )
    {
        const size_t    alignSize = 4096;

        unsigned char*  bptr = (unsigned char*)srcPtr;
        uintptr_t   uiptr = (uintptr_t)bptr;

        srcOffset = uiptr % alignSize;
        bptr -= srcOffset;

        srcPtr = bptr;
    }

    cl_mem  srcBuffer = NULL;

    // Create a USE_HOST_PTR buffer for the passed-in pointer.
    // The size of the buffer will be at least srcOffset + bytesToWrite.
    if( errorCode == CL_SUCCESS )
    {
        size_t  srcBufferSize = srcOffset + bytesToWrite;

        srcBuffer = dispatch().clCreateBuffer(
            context,
            CL_MEM_USE_HOST_PTR | CL_MEM_READ_ONLY,
            srcBufferSize,
            (void*)srcPtr,
            &errorCode );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyBufferHelper(
            context,
            commandQueue,
            srcBuffer,
            dstBuffer,
            srcOffset,
            dstOffset,
            bytesToWrite,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    if( errorCode == CL_SUCCESS )
    {
        if( blockingWrite )
        {
            errorCode = dispatch().clFinish(
                commandQueue );
        }
    }

    dispatch().clReleaseMemObject( srcBuffer );

    return errorCode;
}